

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O2

void __thiscall
QPropertyBindingPrivate::notifyNonRecursive
          (QPropertyBindingPrivate *this,PendingBindingObserverList *bindingObservers)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  
  notifyNonRecursive(this);
  lVar1 = (bindingObservers->super_QVLABase<QPropertyBindingPrivatePtr>).super_QVLABaseBase.s;
  pvVar2 = (bindingObservers->super_QVLABase<QPropertyBindingPrivatePtr>).super_QVLABaseBase.ptr;
  for (lVar3 = 0; lVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
    notifyNonRecursive(*(QPropertyBindingPrivate **)((long)pvVar2 + lVar3));
  }
  return;
}

Assistant:

void QPropertyBindingPrivate::notifyNonRecursive(const PendingBindingObserverList &bindingObservers)
{
    notifyNonRecursive();
    for (auto &&bindingPtr: bindingObservers) {
        auto *binding = static_cast<QPropertyBindingPrivate *>(bindingPtr.get());
        binding->notifyNonRecursive();
    }
}